

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O3

int intra_mode_info_cost_uv
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int mode_cost)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint16_t color_cache [16];
  uint16_t local_58 [20];
  
  BVar1 = mbmi->bsize;
  bVar2 = mbmi->uv_mode;
  if (((bVar2 == 0 && (BLOCK_8X4 < BVar1 && (BVar1 & ~BLOCK_8X4) != BLOCK_64X128)) &
      (BVar1 & ~BLOCK_4X8) != BLOCK_128X64 & (cpi->common).features.allow_screen_content_tools) == 1
     ) {
    bVar3 = (mbmi->palette_mode_info).palette_size[1];
    mode_cost = mode_cost +
                (x->mode_costs).palette_uv_mode_cost
                [(mbmi->palette_mode_info).palette_size[0] != '\0'][bVar3 != 0];
    if (bVar3 != 0) {
      uVar4 = 0x1f;
      if (bVar3 != 0) {
        for (; bVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      iVar6 = (uVar4 ^ 0xffffffe0) + 0x21;
      iVar7 = iVar6 * 0x200;
      iVar8 = iVar7 + -0x200;
      if ((int)((1 << ((byte)iVar6 & 0x1f)) - (uint)bVar3) <=
          (int)(uint)*(x->e_mbd).plane[1].color_index_map) {
        iVar8 = iVar7;
      }
      iVar6 = (x->mode_costs).palette_y_size_cost
              ["\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize]]
              [(ulong)bVar3 + 5];
      iVar7 = av1_get_palette_cache(&x->e_mbd,1,local_58);
      iVar7 = av1_palette_color_cost_uv
                        (&mbmi->palette_mode_info,local_58,iVar7,
                         ((cpi->common).seq_params)->bit_depth);
      iVar5 = av1_cost_color_map(x,1,bsize,mbmi->tx_size,'\0');
      mode_cost = iVar7 + mode_cost + iVar6 + iVar8 + iVar5;
    }
  }
  if ((BLOCK_8X4 < bsize) && (0xf7 < (byte)(get_uv_mode_uv2y[bVar2] - 9))) {
    mode_cost = mode_cost +
                (x->mode_costs).angle_delta_cost[(ulong)(byte)get_uv_mode_uv2y[bVar2] - 1]
                [(long)mbmi->angle_delta[1] + 3];
  }
  return mode_cost;
}

Assistant:

static inline int intra_mode_info_cost_uv(const AV1_COMP *cpi,
                                          const MACROBLOCK *x,
                                          const MB_MODE_INFO *mbmi,
                                          BLOCK_SIZE bsize, int mode_cost) {
  int total_rate = mode_cost;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int use_palette = mbmi->palette_mode_info.palette_size[1] > 0;
  const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
  // Can only activate one mode.
  assert(((uv_mode != UV_DC_PRED) + use_palette + mbmi->use_intrabc) <= 1);

  const int try_palette = av1_allow_palette(
      cpi->common.features.allow_screen_content_tools, mbmi->bsize);
  if (try_palette && uv_mode == UV_DC_PRED) {
    const PALETTE_MODE_INFO *pmi = &mbmi->palette_mode_info;
    total_rate +=
        mode_costs->palette_uv_mode_cost[pmi->palette_size[0] > 0][use_palette];
    if (use_palette) {
      const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);
      const int plt_size = pmi->palette_size[1];
      const MACROBLOCKD *xd = &x->e_mbd;
      const uint8_t *const color_map = xd->plane[1].color_index_map;
      int palette_mode_cost =
          mode_costs
              ->palette_uv_size_cost[bsize_ctx][plt_size - PALETTE_MIN_SIZE] +
          write_uniform_cost(plt_size, color_map[0]);
      uint16_t color_cache[2 * PALETTE_MAX_SIZE];
      const int n_cache = av1_get_palette_cache(xd, 1, color_cache);
      palette_mode_cost += av1_palette_color_cost_uv(
          pmi, color_cache, n_cache, cpi->common.seq_params->bit_depth);
      palette_mode_cost +=
          av1_cost_color_map(x, 1, bsize, mbmi->tx_size, PALETTE_MAP);
      total_rate += palette_mode_cost;
    }
  }
  const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
  if (av1_is_directional_mode(intra_mode)) {
    if (av1_use_angle_delta(bsize)) {
      total_rate +=
          mode_costs->angle_delta_cost[intra_mode - V_PRED]
                                      [mbmi->angle_delta[PLANE_TYPE_UV] +
                                       MAX_ANGLE_DELTA];
    }
  }
  return total_rate;
}